

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_method_diffie_hellman_group1_sha1_key_exchange
              (LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  int iVar1;
  BIGNUM *pBVar2;
  char *errmsg;
  EVP_MD_CTX *exchange_hash_ctx;
  
  if (key_state->state == libssh2_NB_state_idle) {
    pBVar2 = BN_new();
    key_state->p = (BIGNUM *)pBVar2;
    pBVar2 = BN_new();
    key_state->g = (BIGNUM *)pBVar2;
    errmsg = "Failed to allocate key state g.";
    if ((pBVar2 != (BIGNUM *)0x0) && (iVar1 = BN_set_word(pBVar2,2), iVar1 != 0)) {
      errmsg = "Failed to allocate key state p.";
      if ((key_state->p != (BIGNUM *)0x0) &&
         (iVar1 = _libssh2_bn_from_bin
                            (key_state->p,0x80,
                             kex_method_diffie_hellman_group1_sha1_key_exchange::p_value),
         iVar1 == 0)) {
        key_state->state = libssh2_NB_state_created;
        goto LAB_0011473e;
      }
    }
    iVar1 = _libssh2_error(session,-6,errmsg);
  }
  else {
LAB_0011473e:
    iVar1 = diffie_hellman_sha_algo
                      (session,key_state->g,key_state->p,0x80,1,&exchange_hash_ctx,'\x1e','\x1f',
                       (uchar *)0x0,0,&key_state->exchange_state);
    if (iVar1 == -0x25) {
      return -0x25;
    }
  }
  kex_diffie_hellman_cleanup(session,key_state);
  return iVar1;
}

Assistant:

static int
kex_method_diffie_hellman_group1_sha1_key_exchange(LIBSSH2_SESSION *session,
                                                   key_exchange_state_low_t
                                                   * key_state)
{
    static const unsigned char p_value[128] = {
        0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
        0xC9, 0x0F, 0xDA, 0xA2, 0x21, 0x68, 0xC2, 0x34,
        0xC4, 0xC6, 0x62, 0x8B, 0x80, 0xDC, 0x1C, 0xD1,
        0x29, 0x02, 0x4E, 0x08, 0x8A, 0x67, 0xCC, 0x74,
        0x02, 0x0B, 0xBE, 0xA6, 0x3B, 0x13, 0x9B, 0x22,
        0x51, 0x4A, 0x08, 0x79, 0x8E, 0x34, 0x04, 0xDD,
        0xEF, 0x95, 0x19, 0xB3, 0xCD, 0x3A, 0x43, 0x1B,
        0x30, 0x2B, 0x0A, 0x6D, 0xF2, 0x5F, 0x14, 0x37,
        0x4F, 0xE1, 0x35, 0x6D, 0x6D, 0x51, 0xC2, 0x45,
        0xE4, 0x85, 0xB5, 0x76, 0x62, 0x5E, 0x7E, 0xC6,
        0xF4, 0x4C, 0x42, 0xE9, 0xA6, 0x37, 0xED, 0x6B,
        0x0B, 0xFF, 0x5C, 0xB6, 0xF4, 0x06, 0xB7, 0xED,
        0xEE, 0x38, 0x6B, 0xFB, 0x5A, 0x89, 0x9F, 0xA5,
        0xAE, 0x9F, 0x24, 0x11, 0x7C, 0x4B, 0x1F, 0xE6,
        0x49, 0x28, 0x66, 0x51, 0xEC, 0xE6, 0x53, 0x81,
        0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF
    };

    int ret;
    libssh2_sha1_ctx exchange_hash_ctx;

    if(key_state->state == libssh2_NB_state_idle) {
        /* g == 2 */
        key_state->p = _libssh2_bn_init_from_bin(); /* SSH2 defined value
                                                       (p_value) */
        key_state->g = _libssh2_bn_init();      /* SSH2 defined value (2) */

        /* Initialize P and G */
        if(!key_state->g || _libssh2_bn_set_word(key_state->g, 2)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Failed to allocate key state g.");
            goto clean_exit;
        }
        if(!key_state->p || _libssh2_bn_from_bin(key_state->p, 128, p_value)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Failed to allocate key state p.");
            goto clean_exit;
        }

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating Diffie-Hellman Group1 Key Exchange"));

        key_state->state = libssh2_NB_state_created;
    }

    ret = diffie_hellman_sha_algo(session, key_state->g, key_state->p, 128, 1,
                                  (void *)&exchange_hash_ctx,
                                  SSH_MSG_KEXDH_INIT, SSH_MSG_KEXDH_REPLY,
                                  NULL, 0, &key_state->exchange_state);
    if(ret == LIBSSH2_ERROR_EAGAIN) {
        return ret;
    }

clean_exit:
    kex_diffie_hellman_cleanup(session, key_state);

    return ret;
}